

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void Range_Normalize(CPpmd7z_RangeDec *p)

{
  uint uVar1;
  UInt32 UVar2;
  byte bVar3;
  
  do {
    uVar1 = p->Low;
    if (0xffffff < (p->Range + uVar1 ^ uVar1)) {
      if (p->Bottom <= p->Range) {
        return;
      }
      p->Range = p->Bottom - 1 & -uVar1;
    }
    UVar2 = p->Code;
    bVar3 = (*p->Stream->Read)(p->Stream);
    p->Code = (uint)bVar3 | UVar2 << 8;
    p->Range = p->Range << 8;
    p->Low = p->Low << 8;
  } while( true );
}

Assistant:

static void Range_Normalize(CPpmd7z_RangeDec *p)
{
  while (1)
  {
    if((p->Low ^ (p->Low + p->Range)) >= kTopValue)
    {
      if(p->Range >= p->Bottom)
        break;
      else
        p->Range = ((uint32_t)(-(int32_t)p->Low)) & (p->Bottom - 1);
    }
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}